

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall
QList<QWindowSystemInterface::TouchPoint>::reserve
          (QList<QWindowSystemInterface::TouchPoint> *this,qsizetype asize)

{
  ArrayOptions *pAVar1;
  uint uVar2;
  Data *pDVar3;
  Data *pDVar4;
  undefined4 uVar5;
  TouchPoint *data;
  TouchPoint *pTVar6;
  long lVar7;
  TouchPoint *pTVar8;
  TouchPoint *pTVar9;
  TouchPoint *pTVar10;
  qsizetype qVar11;
  TouchPoint *pTVar12;
  long in_FS_OFFSET;
  byte bVar13;
  QArrayData *d;
  QArrayDataPointer<QWindowSystemInterface::TouchPoint> local_38;
  long local_18;
  
  bVar13 = 0;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->d).d;
  if ((pDVar3 != (Data *)0x0) &&
     (asize <= ((long)((long)(this->d).ptr -
                      ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 3) * 0x1111111111111111 + (pDVar3->super_QArrayData).alloc)) {
    uVar2 = (pDVar3->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
            super_QFlagsStorage<QArrayData::ArrayOption>.i;
    if ((uVar2 & 1) != 0) goto LAB_0010c1ad;
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 1) {
      (pDVar3->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
      super_QFlagsStorage<QArrayData::ArrayOption>.i = uVar2 | 1;
      goto LAB_0010c1ad;
    }
  }
  lVar7 = (this->d).size;
  if (asize < lVar7) {
    asize = lVar7;
  }
  local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
  pTVar6 = (TouchPoint *)QArrayData::allocate((QArrayData **)&local_38,0x78,0x10,asize,KeepSize);
  local_38.size = 0;
  lVar7 = (this->d).size;
  if (lVar7 < 1) {
    qVar11 = 0;
  }
  else {
    pTVar8 = (this->d).ptr;
    pTVar12 = pTVar8 + lVar7;
    do {
      pTVar6[local_38.size].velocity.v[1] = (pTVar8->velocity).v[1];
      pTVar9 = pTVar8;
      pTVar10 = pTVar6 + local_38.size;
      for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
        uVar5 = *(undefined4 *)&pTVar9->field_0x4;
        pTVar10->id = pTVar9->id;
        *(undefined4 *)&pTVar10->field_0x4 = uVar5;
        pTVar9 = (TouchPoint *)((long)pTVar9 + (ulong)bVar13 * -0x10 + 8);
        pTVar10 = (TouchPoint *)((long)pTVar10 + (ulong)bVar13 * -0x10 + 8);
      }
      pDVar4 = (pTVar8->rawPositions).d.d;
      pTVar6[local_38.size].rawPositions.d.d = pDVar4;
      pTVar6[local_38.size].rawPositions.d.ptr = (pTVar8->rawPositions).d.ptr;
      pTVar6[local_38.size].rawPositions.d.size = (pTVar8->rawPositions).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pTVar8 = pTVar8 + 1;
      qVar11 = local_38.size + 1;
      local_38.size = qVar11;
    } while (pTVar8 < pTVar12);
  }
  if (local_38.d != (Data *)0x0) {
    pAVar1 = &((local_38.d)->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  pDVar3 = (this->d).d;
  local_38.ptr = (this->d).ptr;
  (this->d).d = local_38.d;
  (this->d).ptr = pTVar6;
  local_38.size = (this->d).size;
  (this->d).size = qVar11;
  local_38.d = pDVar3;
  QArrayDataPointer<QWindowSystemInterface::TouchPoint>::~QArrayDataPointer(&local_38);
LAB_0010c1ad:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}